

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O0

void __thiscall
boost::unit_test::output::junit_impl::junit_log_helper::clear(junit_log_helper *this)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  std::
  vector<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry,_std::allocator<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry>_>
  ::clear((vector<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry,_std::allocator<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry>_>
           *)0x236dfc);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(in_RDI);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(in_RDI);
  std::__cxx11::string::clear();
  *(undefined1 *)
   &in_RDI[4].
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = 0;
  return;
}

Assistant:

void clear() {
          assertion_entries.clear();
          system_out.clear();
          system_err.clear();
          skipping_reason.clear();
          skipping = false;
      }